

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casts.h
# Opt level: O0

Shape * down_cast<S2Polyline::Shape_const*,S2Shape_const>(S2Shape *f)

{
  bool bVar1;
  long local_28;
  S2Shape *f_local;
  
  bVar1 = true;
  if (f != (S2Shape *)0x0) {
    if (f == (S2Shape *)0x0) {
      local_28 = 0;
    }
    else {
      local_28 = __dynamic_cast(f,&S2Shape::typeinfo,&S2Polyline::Shape::typeinfo,0);
    }
    bVar1 = local_28 != 0;
  }
  if (!bVar1) {
    __assert_fail("f == nullptr || dynamic_cast<To>(f) != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/base/casts.h"
                  ,0x44,
                  "To down_cast(From *) [To = const S2Polyline::Shape *, From = const S2Shape]");
  }
  return (Shape *)f;
}

Assistant:

inline To down_cast(From* f) {           // so we only accept pointers
  static_assert(
      (std::is_base_of<From, typename std::remove_pointer<To>::type>::value),
      "target type not derived from source type");

  // We skip the assert and hence the dynamic_cast if RTTI is disabled.
#if !defined(__GNUC__) || defined(__GXX_RTTI)
  // Uses RTTI in dbg and fastbuild. asserts are disabled in opt builds.
  assert(f == nullptr || dynamic_cast<To>(f) != nullptr);
#endif  // !defined(__GNUC__) || defined(__GXX_RTTI)

  return static_cast<To>(f);
}